

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sa_sampler.hpp
# Opt level: O1

void __thiscall
openjij::sampler::SASampler<openjij::graph::BinaryPolynomialModel<double>_>::SASampler
          (SASampler<openjij::graph::BinaryPolynomialModel<double>_> *this,
          BinaryPolynomialModel<double> *model)

{
  size_t sVar1;
  ValueType VVar2;
  int32_t iVar3;
  undefined4 uVar4;
  uint uVar5;
  __alloc_node_gen_t __alloc_node_gen;
  anon_union_5000_2_650ea050_for_random_device_0 local_13b8;
  
  iVar3 = model->system_size_;
  (this->model_).degree_ = model->degree_;
  (this->model_).system_size_ = iVar3;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::vector(&(this->model_).index_list_,&model->index_list_);
  local_13b8.field_0._M_file = &(this->model_).index_map_;
  (this->model_).index_map_._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->model_).index_map_._M_h._M_bucket_count = (model->index_map_)._M_h._M_bucket_count;
  (this->model_).index_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->model_).index_map_._M_h._M_element_count = (model->index_map_)._M_h._M_element_count;
  uVar4 = *(undefined4 *)&(model->index_map_)._M_h._M_rehash_policy.field_0x4;
  sVar1 = (model->index_map_)._M_h._M_rehash_policy._M_next_resize;
  (this->model_).index_map_._M_h._M_rehash_policy._M_max_load_factor =
       (model->index_map_)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->model_).index_map_._M_h._M_rehash_policy.field_0x4 = uVar4;
  (this->model_).index_map_._M_h._M_rehash_policy._M_next_resize = sVar1;
  (this->model_).index_map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::variant<int,std::__cxx11::string,std::vector<std::variant<int,std::__cxx11::string>,std::allocator<std::variant<int,std::__cxx11::string>>>>,std::pair<std::variant<int,std::__cxx11::string,std::vector<std::variant<int,std::__cxx11::string>,std::allocator<std::variant<int,std::__cxx11::string>>>>const,int>,std::allocator<std::pair<std::variant<int,std::__cxx11::string,std::vector<std::variant<int,std::__cxx11::string>,std::allocator<std::variant<int,std::__cxx11::string>>>>const,int>>,std::__detail::_Select1st,std::equal_to<std::variant<int,std::__cxx11::string,std::vector<std::variant<int,std::__cxx11::string>,std::allocator<std::variant<int,std::__cxx11::string>>>>>,openjij::utility::IndexHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::variant<int,std::__cxx11::string,std::vector<std::variant<int,std::__cxx11::string>,std::allocator<std::variant<int,std::__cxx11::string>>>>,std::pair<std::variant<int,std::__cxx11::string,std::vector<std::variant<int,std::__cxx11::string>,std::allocator<std::variant<int,std::__cxx11::string>>>>const,int>,std::allocator<std::pair<std::variant<int,std::__cxx11::string,std::vector<std::variant<int,std::__cxx11::string>,std::allocator<std::variant<int,std::__cxx11::string>>>>const,int>>,std::__detail::_Select1st,std::equal_to<std::variant<int,std::__cxx11::string,std::vector<std::variant<int,std::__cxx11::string>,std::allocator<std::variant<int,std::__cxx11::string>>>>>,openjij::utility::IndexHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::variant<int,std::__cxx11::string,std::vector<std::variant<int,std::__cxx11::string>,std::allocator<std::variant<int,std::__cxx11::string>>>>const,int>,true>>>>
            ((_Hashtable<std::variant<int,std::__cxx11::string,std::vector<std::variant<int,std::__cxx11::string>,std::allocator<std::variant<int,std::__cxx11::string>>>>,std::pair<std::variant<int,std::__cxx11::string,std::vector<std::variant<int,std::__cxx11::string>,std::allocator<std::variant<int,std::__cxx11::string>>>>const,int>,std::allocator<std::pair<std::variant<int,std::__cxx11::string,std::vector<std::variant<int,std::__cxx11::string>,std::allocator<std::variant<int,std::__cxx11::string>>>>const,int>>,std::__detail::_Select1st,std::equal_to<std::variant<int,std::__cxx11::string,std::vector<std::variant<int,std::__cxx11::string>,std::allocator<std::variant<int,std::__cxx11::string>>>>>,openjij::utility::IndexHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_13b8.field_0._M_file,&(model->index_map_)._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_true>_>_>
              *)&local_13b8.field_0);
  std::
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  ::vector(&(this->model_).key_value_list_,&model->key_value_list_);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&(this->model_).adjacency_list_,&model->adjacency_list_);
  (this->model_).min_max_energy_difference_ratio_ = model->min_max_energy_difference_ratio_;
  VVar2 = model->estimated_max_energy_difference_;
  (this->model_).estimated_min_energy_difference_ = model->estimated_min_energy_difference_;
  (this->model_).estimated_max_energy_difference_ = VVar2;
  this->num_sweeps_ = 1000;
  this->num_reads_ = 1;
  this->num_threads_ = 1;
  this->beta_min_ = 1.0;
  this->beta_max_ = 1.0;
  this->update_method_ = METROPOLIS;
  this->random_number_engine_ = XORSHIFT;
  this->schedule_ = GEOMETRIC;
  std::random_device::random_device((random_device *)&local_13b8.field_0);
  uVar5 = std::random_device::_M_getval();
  std::random_device::_M_fini();
  this->seed_ = (ulong)uVar5;
  (this->samples_).
  super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->samples_).
  super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->samples_).
  super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

SASampler(const ModelType &model): model_(model) {}